

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soupfile.hh
# Opt level: O0

size_t __thiscall
helix::nasdaq::soupfile_session<helix::nasdaq::nordic_itch_handler>::process_packet
          (soupfile_session<helix::nasdaq::nordic_itch_handler> *this,packet_view *packet)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  int iVar1;
  size_type sVar2;
  runtime_error *prVar3;
  size_t sVar4;
  long lVar5;
  nordic_itch_handler *in_RDI;
  size_t nr;
  size_type terminator_start;
  string_view view;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  packet_view *in_stack_ffffffffffffff90;
  packet_view local_19;
  size_t local_8;
  
  if (process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&process_packet(helix::net::packet_view_const&)::
                                 terminator_abi_cxx11_);
    if (iVar1 != 0) {
      in_stack_ffffffffffffff90 = &local_19;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_,
                 "\r\n",(allocator *)in_stack_ffffffffffffff90);
      std::allocator<char>::~allocator((allocator<char> *)&local_19);
      __cxa_atexit(std::__cxx11::string::~string,
                   process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_);
    }
  }
  net::packet_view::as_string_view((packet_view *)0x14c808);
  std::experimental::fundamentals_v1::basic_string_view<char,std::char_traits<char>>::
  basic_string_view<std::allocator<char>>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  __str._M_str = (char *)in_stack_ffffffffffffff90;
  __str._M_len = in_stack_ffffffffffffff88;
  sVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
          find_first_of(in_stack_ffffffffffffff80,__str,(size_type)in_stack_ffffffffffffff78);
  if (sVar2 == 0xffffffffffffffff) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"packet is truncated");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (sVar2 == 0) {
    local_8 = 0;
  }
  else {
    sVar4 = nordic_itch_handler::process_packet(in_RDI,in_stack_ffffffffffffff90);
    if (sVar2 < sVar4) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"parsed message is larger than the framing");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar5 = std::__cxx11::string::size();
    local_8 = sVar2 + lVar5;
  }
  return local_8;
}

Assistant:

size_t soupfile_session<Handler>::process_packet(const net::packet_view& packet)
{
    static std::string terminator = "\r\n";
    auto view = packet.as_string_view();
    auto terminator_start = view.find_first_of(terminator);
    if (terminator_start == std::experimental::string_view::npos) {
        throw std::runtime_error("packet is truncated");
    }
    if (!terminator_start) {
        return 0;
    }
    auto nr = _handler.process_packet(packet);
    if (nr > terminator_start) {
        throw std::runtime_error("parsed message is larger than the framing");
    }
    return terminator_start + terminator.size();
}